

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * unixTempFileDir(void)

{
  int iVar1;
  char *local_b0;
  char *zDir;
  stat buf;
  uint i;
  
  buf.__glibc_reserved[2]._4_4_ = 0;
  local_b0 = sqlite3_temp_directory;
  if (unixTempFileDir::azDirs[0] == (char *)0x0) {
    unixTempFileDir::azDirs[0] = getenv("SQLITE_TMPDIR");
  }
  if (unixTempFileDir::azDirs[1] == (char *)0x0) {
    unixTempFileDir::azDirs[1] = getenv("TMPDIR");
  }
  while ((((local_b0 == (char *)0x0 || (iVar1 = (*aSyscall[4].pCurrent)(local_b0,&zDir), iVar1 != 0)
           ) || (((uint)buf.st_nlink & 0xf000) != 0x4000)) ||
         (iVar1 = (*aSyscall[2].pCurrent)(local_b0,3), iVar1 != 0))) {
    if (5 < buf.__glibc_reserved[2]._4_4_) {
      return (char *)0x0;
    }
    local_b0 = unixTempFileDir::azDirs[buf.__glibc_reserved[2]._4_4_];
    buf.__glibc_reserved[2]._4_4_ = buf.__glibc_reserved[2]._4_4_ + 1;
  }
  return local_b0;
}

Assistant:

static const char *unixTempFileDir(void){
  static const char *azDirs[] = {
     0,
     0,
     "/var/tmp",
     "/usr/tmp",
     "/tmp",
     "."
  };
  unsigned int i = 0;
  struct stat buf;
  const char *zDir = sqlite3_temp_directory;

  if( !azDirs[0] ) azDirs[0] = getenv("SQLITE_TMPDIR");
  if( !azDirs[1] ) azDirs[1] = getenv("TMPDIR");
  while(1){
    if( zDir!=0
     && osStat(zDir, &buf)==0
     && S_ISDIR(buf.st_mode)
     && osAccess(zDir, 03)==0
    ){
      return zDir;
    }
    if( i>=sizeof(azDirs)/sizeof(azDirs[0]) ) break;
    zDir = azDirs[i++];
  }
  return 0;
}